

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duseltronik.hpp
# Opt level: O2

bool tao::pegtl::internal::
     duseltronik<ovf::detail::parse::v2::value,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)0,ovf::detail::parse::v2::ovf_segment_header_action,ovf::detail::parse::v2::ovf_segment_header_control,(tao::pegtl::internal::dusel_mode)2>
     ::
     match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment&>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,ovf_file *st,ovf_segment *st_1)

{
  iterator_t *piVar1;
  bool bVar2;
  marker<tao::pegtl::internal::iterator,_(tao::pegtl::rewind_mode)1> m;
  iterator local_58;
  iterator_t *local_38;
  
  piVar1 = &(in->
            super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_current;
  local_58.data =
       (in->
       super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ).m_current.data;
  local_58.byte =
       (in->
       super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ).m_current.byte;
  local_58.line =
       (in->
       super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ).m_current.line;
  local_58.byte_in_line =
       (in->
       super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ).m_current.byte_in_line;
  local_38 = piVar1;
  bVar2 = until<tao::pegtl::at<ovf::detail::parse::v2::line_end>_>::
          match<(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)0,_ovf::detail::parse::v2::ovf_segment_header_action,_ovf::detail::parse::v2::ovf_segment_header_control,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ovf_file_&,_ovf_segment_&>
                    (in,st,st_1);
  if (bVar2) {
    normal<ovf::detail::parse::v2::value>::
    apply<ovf::detail::parse::v2::ovf_segment_header_action,_tao::pegtl::internal::iterator,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ovf_file_&,_ovf_segment_&>
              (&local_58,in,st,st_1);
  }
  else {
    (in->
    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).m_current.line = local_58.line;
    (in->
    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).m_current.byte_in_line = local_58.byte_in_line;
    piVar1->data = local_58.data;
    (in->
    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).m_current.byte = local_58.byte;
  }
  return bVar2;
}

Assistant:

static bool match( Input& in, States&&... st )
            {
               auto m = in.template mark< rewind_mode::required >();

               Control< Rule >::start( static_cast< const Input& >( in ), st... );

               if( duseltronik< Rule, A, rewind_mode::active, Action, Control, dusel_mode::nothing >::match( in, st... ) ) {
                  Control< Rule >::template apply< Action >( m.iterator(), static_cast< const Input& >( in ), st... );
                  Control< Rule >::success( static_cast< const Input& >( in ), st... );
                  return m( true );
               }
               Control< Rule >::failure( static_cast< const Input& >( in ), st... );
               return false;
            }